

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

DistItemSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::DistItemSyntax,slang::syntax::ExpressionSyntax&,slang::syntax::DistWeightSyntax*>
          (BumpAllocator *this,ExpressionSyntax *args,DistWeightSyntax **args_1)

{
  DistWeightSyntax *weight;
  ExpressionSyntax *in_RDX;
  DistItemSyntax *in_RSI;
  BumpAllocator *in_RDI;
  
  weight = (DistWeightSyntax *)allocate(in_RDI,(size_t)in_RSI,(size_t)in_RDX);
  slang::syntax::DistItemSyntax::DistItemSyntax(in_RSI,in_RDX,weight);
  return (DistItemSyntax *)weight;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }